

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void InitDefaultsscc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto
               (void)

{
  google::protobuf::internal::VerifyVersion
            (0x2df5a4,0x2df5a0,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/LLNL[P]wcs/build_O2/src/src/google/protobuf/descriptor.pb.cc"
            );
  google::protobuf::DescriptorProto_ExtensionRange::DescriptorProto_ExtensionRange
            ((DescriptorProto_ExtensionRange *)
             google::protobuf::_DescriptorProto_ExtensionRange_default_instance_);
  google::protobuf::internal::OnShutdownDestroyMessage
            (google::protobuf::_DescriptorProto_ExtensionRange_default_instance_);
  google::protobuf::_DescriptorProto_ExtensionRange_default_instance_._24_8_ =
       google::protobuf::_ExtensionRangeOptions_default_instance_;
  return;
}

Assistant:

static void InitDefaultsscc_info_DescriptorProto_ExtensionRange_google_2fprotobuf_2fdescriptor_2eproto() {
  GOOGLE_PROTOBUF_VERIFY_VERSION;

  {
    void* ptr = &PROTOBUF_NAMESPACE_ID::_DescriptorProto_ExtensionRange_default_instance_;
    new (ptr) PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange();
    ::PROTOBUF_NAMESPACE_ID::internal::OnShutdownDestroyMessage(ptr);
  }
  PROTOBUF_NAMESPACE_ID::DescriptorProto_ExtensionRange::InitAsDefaultInstance();
}